

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::OptimizeIndirUses
          (GlobOpt *this,IndirOpnd *indirOpnd,Instr **pInstr,Value **indirIndexValRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  Value *pVVar5;
  Value *indexVal;
  RegOpnd *indexOpnd;
  Instr **instr;
  Value **indirIndexValRef_local;
  Instr **pInstr_local;
  IndirOpnd *indirOpnd_local;
  GlobOpt *this_local;
  
  if ((indirIndexValRef != (Value **)0x0) && (*indirIndexValRef != (Value *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4095,"(!indirIndexValRef || !*indirIndexValRef)",
                       "!indirIndexValRef || !*indirIndexValRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pRVar4 = IR::IndirOpnd::GetBaseOpnd(indirOpnd);
  OptSrc(this,&pRVar4->super_Opnd,pInstr,(Value **)0x0,indirOpnd);
  pRVar4 = IR::IndirOpnd::GetIndexOpnd(indirOpnd);
  if ((pRVar4 != (RegOpnd *)0x0) &&
     (pVVar5 = OptSrc(this,&pRVar4->super_Opnd,pInstr,(Value **)0x0,indirOpnd),
     indirIndexValRef != (Value **)0x0)) {
    *indirIndexValRef = pVVar5;
  }
  return;
}

Assistant:

void
GlobOpt::OptimizeIndirUses(IR::IndirOpnd *indirOpnd, IR::Instr * *pInstr, Value **indirIndexValRef)
{
    IR::Instr * &instr = *pInstr;
    Assert(!indirIndexValRef || !*indirIndexValRef);

    // Update value types and copy-prop the base
    OptSrc(indirOpnd->GetBaseOpnd(), &instr, nullptr, indirOpnd);

    IR::RegOpnd *indexOpnd = indirOpnd->GetIndexOpnd();
    if (!indexOpnd)
    {
        return;
    }

    // Update value types and copy-prop the index
    Value *indexVal = OptSrc(indexOpnd, &instr, nullptr, indirOpnd);
    if(indirIndexValRef)
    {
        *indirIndexValRef = indexVal;
    }
}